

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_astring.c
# Opt level: O1

void test_AString_construct_destruct_fromCString_valid_fn(int _i)

{
  int iVar1;
  AString *str;
  char *pcVar2;
  char *expr;
  char **ppcVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  char *__s2;
  char *pcStack_50;
  char *pcStack_48;
  char *pcStack_40;
  char *pcStack_38;
  char *pcStack_30;
  char *local_28;
  undefined8 uStack_20;
  
  uStack_20 = 0x11dc47;
  str = AString_constructFromCString("xyz1234567890",3);
  if (str == (AString *)0x0) {
    pcVar6 = "(void*) string != NULL";
    pcVar4 = "(void*) string";
    iVar1 = 0x5d;
LAB_0011de49:
    uStack_20 = 0;
    local_28 = (char *)0x0;
    pcStack_30 = (char *)0x11de50;
    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,iVar1,"Assertion \'_ck_x != NULL\' failed",
                      "Assertion \'%s\' failed: %s == %#x",pcVar6,pcVar4);
  }
  uStack_20 = 0x11dc64;
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x5d);
  if (str->reallocator == (ACUtilsReallocator)0x0) {
    pcVar6 = "(void*) string->reallocator != NULL";
    pcVar4 = "(void*) string->reallocator";
    iVar1 = 0x5e;
    goto LAB_0011de49;
  }
  uStack_20 = 0x11dc7f;
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x5e);
  if (str->deallocator == (ACUtilsDeallocator)0x0) {
    pcVar6 = "(void*) string->deallocator != NULL";
    pcVar4 = "(void*) string->deallocator";
    iVar1 = 0x5f;
    goto LAB_0011de49;
  }
  uStack_20 = 0x11dc9b;
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x5f);
  pcVar6 = (char *)str->capacity;
  if (pcVar6 == (char *)0x8) {
    uStack_20 = 0x11dcba;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x60);
    if (str->buffer == (char *)0x0) {
      pcVar6 = "(void*) (*string).buffer != NULL";
      pcVar4 = "(void*) (*string).buffer";
      iVar1 = 0x60;
      goto LAB_0011de49;
    }
    uStack_20 = 0x11dcd6;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x60);
    __s2 = str->buffer;
    if (__s2 == (char *)0x0) {
      pcVar6 = "";
      __s2 = "(null)";
    }
    else {
      uStack_20 = 0x11dcf2;
      iVar1 = strcmp("xyz",__s2);
      if (iVar1 == 0) {
        uStack_20 = 0x11dd0b;
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,0x60);
        pcVar6 = (char *)str->size;
        if (pcVar6 == (char *)0x3) {
          uStack_20 = 0x11dd2a;
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x60);
          AString_destruct(str);
          return;
        }
        pcStack_30 = "strlen(\"xyz\")";
        pcVar4 = "(*string).size == strlen(\"xyz\")";
        pcVar5 = "(*string).size";
        local_28 = (char *)0x3;
        goto LAB_0011deea;
      }
      pcVar6 = "\"";
    }
    expr = 
    "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
    ;
    pcVar2 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
    pcVar4 = "(*string).buffer == (\"xyz\")";
    pcVar5 = "(*string).buffer";
    local_28 = "\"";
    pcStack_30 = "xyz";
    pcStack_38 = "\"";
    pcStack_40 = "(\"xyz\")";
    ppcVar3 = &pcStack_50;
    pcStack_50 = __s2;
    pcStack_48 = pcVar6;
  }
  else {
    pcStack_30 = "(8)";
    pcVar4 = "(*string).capacity == (8)";
    pcVar5 = "(*string).capacity";
    local_28 = (char *)0x8;
LAB_0011deea:
    expr = "Assertion \'_ck_x == _ck_y\' failed";
    pcVar2 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
    ppcVar3 = &pcStack_30;
  }
  uStack_20 = 0;
  *(char **)((long)ppcVar3 + -8) = pcVar6;
  *(code **)((long)ppcVar3 + -0x10) = test_AString_construct_destruct_withAllocator_valid_fn;
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,0x60,expr,pcVar2,pcVar4,pcVar5);
}

Assistant:

END_TEST
START_TEST(test_AString_construct_destruct_fromCString_valid)
{
    struct AString *string = AString_constructFromCString("xyz1234567890", 3);
    ACUTILSTEST_ASSERT_PTR_NONNULL(string);
    ACUTILSTEST_ASSERT_PTR_NONNULL(string->reallocator);
    ACUTILSTEST_ASSERT_PTR_NONNULL(string->deallocator);
    ACUTILSTEST_ASTRING_CHECK_ASTRING(*string, "xyz", 8);
    AString_destruct(string);
}